

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::PlainSkipTemplated<duckdb::TemplatedParquetValueConversion<unsigned_long>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainSkipTemplatedDefines<duckdb::TemplatedParquetValueConversion<unsigned_long>,true>
              (this,plain_data,defines,num_values);
    return;
  }
  PlainSkipTemplatedDefines<duckdb::TemplatedParquetValueConversion<unsigned_long>,false>
            (this,plain_data,defines,num_values);
  return;
}

Assistant:

void PlainSkipTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (HasDefines() && defines) {
			PlainSkipTemplatedDefines<CONVERSION, true>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedDefines<CONVERSION, false>(plain_data, defines, num_values);
		}
	}